

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteDeviceLibraryRules
          (cmMakefileLibraryTargetGenerator *this,string *linkRuleVar,bool relink)

{
  unsigned_long *puVar1;
  bool linkScriptShell;
  cmMakefile *pcVar2;
  cmLocalUnixMakefileGenerator3 *pcVar3;
  cmGeneratorTarget *target_00;
  pointer pbVar4;
  bool useResponseFile;
  bool forResponse;
  bool useWatcomQuote;
  TargetType TVar5;
  string *psVar6;
  cmLinkLineComputer *this_00;
  char *pcVar7;
  undefined4 extraout_var;
  string *relDir;
  cmOutputConverter *pcVar8;
  string *real_link_command;
  pointer __rhs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  real_link_commands;
  string targetFullPathCompilePDB;
  string linkLanguage;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string objectDir;
  string targetOutputReal;
  string linkRule;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libCleanFiles;
  string launcher;
  string target;
  string langFlags;
  string linkFlags;
  string targetOutPathCompilePDB;
  string objExt;
  RuleVariables vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkLanguage,"CUDA",(allocator<char> *)&vars);
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vars,"CMAKE_CUDA_OUTPUT_EXTENSION",(allocator<char> *)&libCleanFiles);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar2,(string *)&vars);
  std::__cxx11::string::string((string *)&objExt,(string *)psVar6);
  std::__cxx11::string::~string((string *)&vars);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefileTargetGenerator::AppendLinkDepends
            (&this->super_cmMakefileTargetGenerator,&depends,&linkLanguage);
  linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
  linkFlags._M_string_length = 0;
  linkFlags.field_2._M_local_buf[0] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&linkFlags,&linkLanguage);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
                 &((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                  GeneratorTarget)->ObjectDirectory,"cmake_device_link");
  std::operator+(&targetOutputReal,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,&objExt)
  ;
  std::__cxx11::string::~string((string *)&vars);
  std::__cxx11::string::_M_assign((string *)&this->DeviceLinkObject);
  puVar1 = &(this->super_cmMakefileTargetGenerator).NumberOfProgressActions;
  *puVar1 = *puVar1 + 1;
  if ((this->super_cmMakefileTargetGenerator).NoRuleMessages == false) {
    vars.CMTargetName = (char *)&vars.TargetPDB;
    vars.CMTargetType = (char *)0x0;
    vars.TargetPDB._0_1_ = 0;
    vars.TargetVersionMajor = (char *)&vars.Language;
    vars.TargetVersionMinor = (char *)0x0;
    vars.Language = (char *)((ulong)vars.Language & 0xffffffffffffff00);
    cmMakefileTargetGenerator::MakeEchoProgress
              (&this->super_cmMakefileTargetGenerator,(EchoProgress *)&vars);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commands1,
                   "Linking ",&linkLanguage);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &libCleanFiles,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commands1,
                   " device code ");
    std::__cxx11::string::~string((string *)&commands1);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)&outputs,(cmLocalGenerator *)pcVar3,psVar6,&this->DeviceLinkObject);
    cmOutputConverter::ConvertToOutputFormat
              ((string *)&commands1,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)&outputs,SHELL);
    std::__cxx11::string::append((string *)&libCleanFiles);
    std::__cxx11::string::~string((string *)&commands1);
    std::__cxx11::string::~string((string *)&outputs);
    cmLocalUnixMakefileGenerator3::AppendEcho
              ((this->super_cmMakefileTargetGenerator).LocalGenerator,&commands,
               (string *)&libCleanFiles,EchoLink,(EchoProgress *)&vars);
    std::__cxx11::string::~string((string *)&libCleanFiles);
    cmLocalUnixMakefileGenerator3::EchoProgress::~EchoProgress((EchoProgress *)&vars);
  }
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
  cmLocalGenerator::MaybeConvertToRelativePath
            ((string *)&vars,(cmLocalGenerator *)pcVar3,psVar6,&targetOutputReal);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&libCleanFiles,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
  std::__cxx11::string::~string((string *)&vars);
  linkScriptShell =
       (((this->super_cmMakefileTargetGenerator).GlobalGenerator)->super_cmGlobalCommonGenerator).
       super_cmGlobalGenerator.UseLinkScript;
  useResponseFile =
       cmMakefileTargetGenerator::CheckUseResponseFileForObjects
                 (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  forResponse = cmMakefileTargetGenerator::CheckUseResponseFileForLibraries
                          (&this->super_cmMakefileTargetGenerator,&linkLanguage);
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&vars);
  vars.Language = linkLanguage._M_dataplus._M_p;
  real_link_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  real_link_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  real_link_commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&commands1,
                 linkRuleVar,"_USE_WATCOM_QUOTE");
  useWatcomQuote = cmMakefile::IsOn(pcVar2,(string *)&commands1);
  std::__cxx11::string::~string((string *)&commands1);
  cmOutputConverter::SetLinkScriptShell
            (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             linkScriptShell);
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&outputs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  outputs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  TVar5 = cmGeneratorTarget::GetType
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (TVar5 != STATIC_LIBRARY) {
    this_00 = (cmLinkLineComputer *)operator_new(0x40);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar8 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    if (pcVar3 == (cmLocalUnixMakefileGenerator3 *)0x0) {
      pcVar8 = (cmOutputConverter *)0x0;
    }
    cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&objectDir,(cmLocalGenerator *)pcVar3);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&commands1,(cmStateSnapshot *)&objectDir);
    cmLinkLineDeviceComputer::cmLinkLineDeviceComputer
              ((cmLinkLineDeviceComputer *)this_00,pcVar8,(cmStateDirectory *)&commands1);
    cmLinkLineComputer::SetForResponse(this_00,forResponse);
    cmLinkLineComputer::SetUseWatcomQuote(this_00,useWatcomQuote);
    cmLinkLineComputer::SetRelink(this_00,relink);
    cmMakefileTargetGenerator::CreateLinkLibs
              (&this->super_cmMakefileTargetGenerator,this_00,(string *)&outputs,forResponse,
               &depends);
    (*this_00->_vptr_cmLinkLineComputer[1])(this_00);
  }
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&commands1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)commands1.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  cmMakefileTargetGenerator::CreateObjectLists
            (&this->super_cmMakefileTargetGenerator,linkScriptShell,false,useResponseFile,
             (string *)&commands1,&depends,useWatcomQuote);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&objectDir,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&targetFullPathCompilePDB,(cmLocalGenerator *)pcVar3,psVar6,&objectDir);
  cmOutputConverter::ConvertToOutputFormat
            (&target,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,&targetFullPathCompilePDB,SHELL);
  std::__cxx11::string::operator=((string *)&objectDir,(string *)&target);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar3);
  cmLocalGenerator::MaybeConvertToRelativePath
            (&targetFullPathCompilePDB,(cmLocalGenerator *)pcVar3,psVar6,&targetOutputReal);
  cmOutputConverter::ConvertToOutputFormat
            (&target,&(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,&targetFullPathCompilePDB,(uint)useWatcomQuote);
  std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
  cmCommonTargetGenerator::ComputeTargetCompilePDB_abi_cxx11_
            (&targetFullPathCompilePDB,(cmCommonTargetGenerator *)this);
  cmOutputConverter::ConvertToOutputFormat
            (&targetOutPathCompilePDB,
             &(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             &targetFullPathCompilePDB,SHELL);
  vars.Objects = (char *)commands1.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
  vars.ObjectDir = objectDir._M_dataplus._M_p;
  vars.Target = target._M_dataplus._M_p;
  vars.LinkLibraries =
       (char *)outputs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  vars.ObjectsQuoted =
       (char *)commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  vars.LinkFlags = linkFlags._M_dataplus._M_p;
  vars.TargetCompilePDB = targetOutPathCompilePDB._M_dataplus._M_p;
  langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
  langFlags._M_string_length = 0;
  langFlags.field_2._M_local_buf[0] = '\0';
  cmLocalGenerator::AddLanguageFlagsForLinking
            ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,&langFlags,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &linkLanguage,
             &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName);
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  vars.LanguageCompileFlags = langFlags._M_dataplus._M_p;
  launcher.field_2._M_local_buf[0] = '\0';
  target_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkRule,"RULE_LAUNCH_LINK",(allocator<char> *)&local_50);
  pcVar7 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar3,target_00,&linkRule);
  std::__cxx11::string::~string((string *)&linkRule);
  if ((pcVar7 != (char *)0x0) && (*pcVar7 != '\0')) {
    std::__cxx11::string::assign((char *)&launcher);
    std::__cxx11::string::append((char *)&launcher);
  }
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
       (*(((this->super_cmMakefileTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
         super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
  std::__cxx11::string::_M_assign
            ((string *)
             rulePlaceholderExpander._M_t.
             super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
             .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl);
  cmMakefileTargetGenerator::GetLinkRule
            (&linkRule,&this->super_cmMakefileTargetGenerator,linkRuleVar);
  cmSystemTools::ExpandListArgument(&linkRule,&real_link_commands,false);
  pbVar4 = real_link_commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = real_link_commands.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pbVar4; __rhs = __rhs + 1) {
    std::operator+(&local_50,&launcher,__rhs);
    std::__cxx11::string::operator=((string *)__rhs,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    pcVar8 = &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
    if (pcVar3 == (cmLocalUnixMakefileGenerator3 *)0x0) {
      pcVar8 = (cmOutputConverter *)0x0;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)
               rulePlaceholderExpander._M_t.
               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar8,__rhs,
               &vars);
  }
  cmOutputConverter::SetLinkScriptShell
            (&(((this->super_cmMakefileTargetGenerator).LocalGenerator)->
              super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,false);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&(this->super_cmMakefileTargetGenerator).CleanFiles,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )libCleanFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&libCleanFiles._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::~string((string *)&linkRule);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr(&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&langFlags);
  std::__cxx11::string::~string((string *)&targetOutPathCompilePDB);
  std::__cxx11::string::~string((string *)&targetFullPathCompilePDB);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&objectDir);
  std::__cxx11::string::~string((string *)&commands1);
  std::__cxx11::string::~string((string *)&outputs);
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (linkScriptShell == false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&commands1,&real_link_commands);
  }
  else {
    pcVar7 = "dlink.txt";
    if (relink) {
      pcVar7 = "drelink.txt";
    }
    cmMakefileTargetGenerator::CreateLinkScript
              (&this->super_cmMakefileTargetGenerator,pcVar7,&real_link_commands,&commands1,&depends
              );
  }
  pcVar3 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                     ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.Makefile
                     );
  relDir = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator);
  cmLocalUnixMakefileGenerator3::CreateCDCommand(pcVar3,&commands1,psVar6,relDir);
  cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&commands,&commands1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&commands1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&outputs,1,&targetOutputReal,(allocator_type *)&objectDir);
  cmMakefileTargetGenerator::WriteMakeRule
            (&this->super_cmMakefileTargetGenerator,
             (ostream *)(this->super_cmMakefileTargetGenerator).BuildFileStream,(char *)0x0,&outputs
             ,&depends,&commands,false);
  cmMakefileTargetGenerator::WriteTargetDriverRule
            (&this->super_cmMakefileTargetGenerator,&targetOutputReal,relink);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&outputs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&real_link_commands);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&libCleanFiles._M_t);
  std::__cxx11::string::~string((string *)&targetOutputReal);
  std::__cxx11::string::~string((string *)&linkFlags);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::__cxx11::string::~string((string *)&objExt);
  std::__cxx11::string::~string((string *)&linkLanguage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteDeviceLibraryRules(
  const std::string& linkRuleVar, bool relink)
{
#ifdef CMAKE_BUILD_WITH_CMAKE
  // TODO: Merge the methods that call this method to avoid
  // code duplication.
  std::vector<std::string> commands;

  // Get the language to use for linking this library.
  std::string linkLanguage = "CUDA";
  std::string const objExt =
    this->Makefile->GetSafeDefinition("CMAKE_CUDA_OUTPUT_EXTENSION");

  // Build list of dependencies.
  std::vector<std::string> depends;
  this->AppendLinkDepends(depends, linkLanguage);

  // Create set of linking flags.
  std::string linkFlags;
  this->GetTargetLinkFlags(linkFlags, linkLanguage);

  // Get the name of the device object to generate.
  std::string const targetOutputReal =
    this->GeneratorTarget->ObjectDirectory + "cmake_device_link" + objExt;
  this->DeviceLinkObject = targetOutputReal;

  this->NumberOfProgressActions++;
  if (!this->NoRuleMessages) {
    cmLocalUnixMakefileGenerator3::EchoProgress progress;
    this->MakeEchoProgress(progress);
    // Add the link message.
    std::string buildEcho = "Linking " + linkLanguage + " device code ";
    buildEcho += this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(),
        this->DeviceLinkObject),
      cmOutputConverter::SHELL);
    this->LocalGenerator->AppendEcho(
      commands, buildEcho, cmLocalUnixMakefileGenerator3::EchoLink, &progress);
  }
  // Clean files associated with this library.
  std::set<std::string> libCleanFiles;
  libCleanFiles.insert(this->LocalGenerator->MaybeConvertToRelativePath(
    this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal));

  // Determine whether a link script will be used.
  bool useLinkScript = this->GlobalGenerator->GetUseLinkScript();

  bool useResponseFileForObjects =
    this->CheckUseResponseFileForObjects(linkLanguage);
  bool const useResponseFileForLibs =
    this->CheckUseResponseFileForLibraries(linkLanguage);

  cmRulePlaceholderExpander::RuleVariables vars;
  vars.Language = linkLanguage.c_str();

  // Expand the rule variables.
  std::vector<std::string> real_link_commands;
  {
    bool useWatcomQuote =
      this->Makefile->IsOn(linkRuleVar + "_USE_WATCOM_QUOTE");

    // Set path conversion for link script shells.
    this->LocalGenerator->SetLinkScriptShell(useLinkScript);

    // Collect up flags to link in needed libraries.
    std::string linkLibs;
    if (this->GeneratorTarget->GetType() != cmStateEnums::STATIC_LIBRARY) {

      std::unique_ptr<cmLinkLineComputer> linkLineComputer(
        new cmLinkLineDeviceComputer(
          this->LocalGenerator,
          this->LocalGenerator->GetStateSnapshot().GetDirectory()));
      linkLineComputer->SetForResponse(useResponseFileForLibs);
      linkLineComputer->SetUseWatcomQuote(useWatcomQuote);
      linkLineComputer->SetRelink(relink);

      this->CreateLinkLibs(linkLineComputer.get(), linkLibs,
                           useResponseFileForLibs, depends);
    }

    // Construct object file lists that may be needed to expand the
    // rule.
    std::string buildObjs;
    this->CreateObjectLists(useLinkScript, false, // useArchiveRules
                            useResponseFileForObjects, buildObjs, depends,
                            useWatcomQuote);

    cmOutputConverter::OutputFormat output = (useWatcomQuote)
      ? cmOutputConverter::WATCOMQUOTE
      : cmOutputConverter::SHELL;

    std::string objectDir = this->GeneratorTarget->GetSupportDirectory();
    objectDir = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), objectDir),
      cmOutputConverter::SHELL);

    std::string target = this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeConvertToRelativePath(
        this->LocalGenerator->GetCurrentBinaryDirectory(), targetOutputReal),
      output);

    std::string targetFullPathCompilePDB = this->ComputeTargetCompilePDB();
    std::string targetOutPathCompilePDB =
      this->LocalGenerator->ConvertToOutputFormat(targetFullPathCompilePDB,
                                                  cmOutputConverter::SHELL);

    vars.Objects = buildObjs.c_str();
    vars.ObjectDir = objectDir.c_str();
    vars.Target = target.c_str();
    vars.LinkLibraries = linkLibs.c_str();
    vars.ObjectsQuoted = buildObjs.c_str();
    vars.LinkFlags = linkFlags.c_str();
    vars.TargetCompilePDB = targetOutPathCompilePDB.c_str();

    // Add language-specific flags.
    std::string langFlags;
    this->LocalGenerator->AddLanguageFlagsForLinking(
      langFlags, this->GeneratorTarget, linkLanguage, this->ConfigName);

    vars.LanguageCompileFlags = langFlags.c_str();

    std::string launcher;
    const char* val = this->LocalGenerator->GetRuleLauncher(
      this->GeneratorTarget, "RULE_LAUNCH_LINK");
    if (val && *val) {
      launcher = val;
      launcher += " ";
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->LocalGenerator->CreateRulePlaceholderExpander());

    // Construct the main link rule and expand placeholders.
    rulePlaceholderExpander->SetTargetImpLib(targetOutputReal);
    std::string linkRule = this->GetLinkRule(linkRuleVar);
    cmSystemTools::ExpandListArgument(linkRule, real_link_commands);

    // Expand placeholders.
    for (std::string& real_link_command : real_link_commands) {
      real_link_command = launcher + real_link_command;
      rulePlaceholderExpander->ExpandRuleVariables(this->LocalGenerator,
                                                   real_link_command, vars);
    }
    // Restore path conversion to normal shells.
    this->LocalGenerator->SetLinkScriptShell(false);

    // Clean all the possible library names and symlinks.
    this->CleanFiles.insert(libCleanFiles.begin(), libCleanFiles.end());
  }

  std::vector<std::string> commands1;
  // Optionally convert the build rule to use a script to avoid long
  // command lines in the make shell.
  if (useLinkScript) {
    // Use a link script.
    const char* name = (relink ? "drelink.txt" : "dlink.txt");
    this->CreateLinkScript(name, real_link_commands, commands1, depends);
  } else {
    // No link script.  Just use the link rule directly.
    commands1 = real_link_commands;
  }
  this->LocalGenerator->CreateCDCommand(
    commands1, this->Makefile->GetCurrentBinaryDirectory(),
    this->LocalGenerator->GetBinaryDirectory());
  cmAppend(commands, commands1);
  commands1.clear();

  // Compute the list of outputs.
  std::vector<std::string> outputs(1, targetOutputReal);

  // Write the build rule.
  this->WriteMakeRule(*this->BuildFileStream, nullptr, outputs, depends,
                      commands, false);

  // Write the main driver rule to build everything in this target.
  this->WriteTargetDriverRule(targetOutputReal, relink);
#else
  static_cast<void>(linkRuleVar);
  static_cast<void>(relink);
#endif
}